

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O1

void nni_plat_udp_recv(nni_plat_udp *udp,nni_aio *aio)

{
  _Bool _Var1;
  nng_err result;
  nni_aio *pnVar2;
  
  nni_aio_reset(aio);
  nni_mtx_lock(&udp->udp_mtx);
  _Var1 = nni_aio_start(aio,nni_plat_udp_cancel,udp);
  if (_Var1) {
    nni_list_append(&udp->udp_recvq,aio);
    pnVar2 = (nni_aio *)nni_list_first(&udp->udp_recvq);
    if (pnVar2 == aio) {
      result = nni_posix_pfd_arm(&udp->udp_pfd,1);
      if (result != NNG_OK) {
        nni_aio_list_remove(aio);
        nni_aio_finish_error(aio,result);
      }
    }
  }
  nni_mtx_unlock(&udp->udp_mtx);
  return;
}

Assistant:

void
nni_plat_udp_recv(nni_plat_udp *udp, nni_aio *aio)
{
	int rv;
	nni_aio_reset(aio);
	nni_mtx_lock(&udp->udp_mtx);
	if (!nni_aio_start(aio, nni_plat_udp_cancel, udp)) {
		nni_mtx_unlock(&udp->udp_mtx);
		return;
	}
	nni_list_append(&udp->udp_recvq, aio);
	if (nni_list_first(&udp->udp_recvq) == aio) {
		if ((rv = nni_posix_pfd_arm(&udp->udp_pfd, NNI_POLL_IN)) !=
		    0) {
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, rv);
		}
	}
	nni_mtx_unlock(&udp->udp_mtx);
}